

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::add
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,int *key)

{
  int *piVar1;
  bool bVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  WeightedGraphAdjSet<int,_int> local_130;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_f8;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *local_b8;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *parent;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  WeightedGraphAdjSet<int,_int> local_98;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_60;
  int *local_20;
  int *key_local;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  local_20 = key;
  key_local = (int *)this;
  bVar2 = isEmpty(this);
  if (bVar2) {
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    piVar1 = local_20;
    node._3_1_ = 1;
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_98);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_60,piVar1,&local_98);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar3,&local_60);
    node._3_1_ = 0;
    this->_root = pRVar3;
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::~TreeElement(&local_60);
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&local_98);
  }
  else {
    parent = this->_root;
    local_b8 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::parent(this->_root);
    while (parent != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                      *)0x0) {
      if ((parent->element).key == *local_20) {
        return this;
      }
      local_b8 = parent;
      if (*local_20 < (parent->element).key) {
        parent = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::left(parent);
      }
      else {
        parent = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::right(parent);
      }
    }
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    piVar1 = local_20;
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_130);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_f8,piVar1,&local_130);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar3,&local_f8);
    parent = pRVar3;
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::~TreeElement(&local_f8);
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&local_130);
    if (*local_20 < (local_b8->element).key) {
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::insertLeft(local_b8,parent,true);
    }
    else {
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::insertRight(local_b8,parent,true);
    }
    while (local_b8 !=
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0) {
      local_b8->node_count = local_b8->node_count + 1;
      pRVar3 = _balance(this,local_b8);
      local_b8 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::parent(pRVar3);
    }
    bVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::isRed(this->_root);
    if (bVar2) {
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::flipColors(this->_root);
    }
  }
  return this;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::add(const Key &key){
        if (isEmpty()) {
            _root = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, Value()));
            return *this;
        }
        auto node = _root;
        auto parent = _root->parent();
        while (node != nullptr) {
            if (node->element.key == key) {
                return *this;
            }
            parent = node;
            if (key < node->element.key) {
                node = node->left();
            } else {
                node = node->right();
            }
        }
        node = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, Value()));
        if (key < parent->element.key) {
            parent->insertLeft(node, true);
        } else {
            parent->insertRight(node, true);
        }
        while (parent != nullptr) {
            parent->node_count++;
            parent = _balance(parent)->parent();
        }
        // reset the root's color
        if (_root->isRed()) {
            _root->flipColors();
        }
        return *this;
    }